

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_seek(PHYSFS_File *handle,PHYSFS_uint64 pos)

{
  int iVar1;
  PHYSFS_sint64 PVar2;
  ulong uVar3;
  PHYSFS_sint64 offset;
  FileHandle *fh;
  PHYSFS_uint64 pos_local;
  PHYSFS_File *handle_local;
  
  if (handle->opaque == (void *)0x0) {
    handle_local._4_4_ = 1;
  }
  else {
    iVar1 = PHYSFS_flush(handle);
    if (iVar1 == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      if ((handle[3].opaque != (void *)0x0) && (*(char *)&handle[1].opaque != '\0')) {
        PVar2 = PHYSFS_tell(handle);
        uVar3 = pos - PVar2;
        if (((-1 < (long)uVar3) &&
            (uVar3 <= (ulong)((long)handle[5].opaque - (long)handle[6].opaque))) ||
           (((long)uVar3 < 0 && ((void *)-uVar3 <= handle[6].opaque)))) {
          handle[6].opaque = (void *)((long)handle[6].opaque + uVar3);
          return 1;
        }
      }
      handle[6].opaque = (void *)0x0;
      handle[5].opaque = (void *)0x0;
      handle_local._4_4_ = (**(code **)((long)handle->opaque + 0x20))(handle->opaque,pos);
    }
  }
  return handle_local._4_4_;
}

Assistant:

int PHYSFS_seek(PHYSFS_File *handle, PHYSFS_uint64 pos)
{
    FileHandle *fh = (FileHandle *) handle;
    if (fh->io == NULL) /* magic stream file; seeks are NOPs */
        return 1;

    BAIL_IF_ERRPASS(!PHYSFS_flush(handle), 0);

    if (fh->buffer && fh->forReading)
    {
        /* avoid throwing away our precious buffer if seeking within it. */
        PHYSFS_sint64 offset = pos - PHYSFS_tell(handle);
        if ( /* seeking within the already-buffered range? */
             /* forward? */
            ((offset >= 0) && (((size_t)offset) <= fh->buffill-fh->bufpos)) ||
            /* backward? */
            ((offset < 0) && (((size_t) -offset) <= fh->bufpos)) )
        {
            fh->bufpos = (size_t) (((PHYSFS_sint64) fh->bufpos) + offset);
            return 1; /* successful seek */
        } /* if */
    } /* if */

    /* we have to fall back to a 'raw' seek. */
    fh->buffill = fh->bufpos = 0;
    return fh->io->seek(fh->io, pos);
}